

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::authored
          (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *this)

{
  bool bVar1;
  size_type sVar2;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *this_local;
  
  if ((this->_empty & 1U) == 0) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->_attrib);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      sVar2 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(&this->_paths);
      if (sVar2 == 0) {
        if ((this->_blocked & 1U) == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool authored() const {
    if (_empty) {  // authored with empty value.
      return true;
    }
    if (_attrib) {
      return true;
    }
    if (_paths.size()) {
      return true;
    }
    if (_blocked) {
      return true;
    }
    return false;
  }